

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_fdset(Curl_multi *multi,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  Curl_easy *data_00;
  int iVar1;
  uint local_54;
  uint i;
  Curl_easy *data;
  Curl_llist_node *e;
  int this_max_fd;
  int *max_fd_local;
  fd_set *exc_fd_set_local;
  fd_set *write_fd_set_local;
  fd_set *read_fd_set_local;
  Curl_multi *multi_local;
  
  e._4_4_ = -1;
  if ((multi == (Curl_multi *)0x0) || (multi->magic != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if (((byte)multi->field_0x279 >> 2 & 1) == 0) {
    for (data = (Curl_easy *)Curl_llist_head(&multi->process); data != (Curl_easy *)0x0;
        data = (Curl_easy *)Curl_node_next((Curl_llist_node *)data)) {
      data_00 = (Curl_easy *)Curl_node_elem((Curl_llist_node *)data);
      multi_getsock(data_00,&data_00->last_poll);
      for (local_54 = 0; local_54 < (data_00->last_poll).num; local_54 = local_54 + 1) {
        if ((data_00->last_poll).sockets[local_54] < 0x400) {
          if (((data_00->last_poll).actions[local_54] & 1) != 0) {
            iVar1 = (data_00->last_poll).sockets[local_54] / 0x40;
            read_fd_set->fds_bits[iVar1] =
                 1L << ((byte)((long)(data_00->last_poll).sockets[local_54] % 0x40) & 0x3f) |
                 read_fd_set->fds_bits[iVar1];
          }
          if (((data_00->last_poll).actions[local_54] & 2) != 0) {
            iVar1 = (data_00->last_poll).sockets[local_54] / 0x40;
            write_fd_set->fds_bits[iVar1] =
                 1L << ((byte)((long)(data_00->last_poll).sockets[local_54] % 0x40) & 0x3f) |
                 write_fd_set->fds_bits[iVar1];
          }
          if (e._4_4_ < (data_00->last_poll).sockets[local_54]) {
            e._4_4_ = (data_00->last_poll).sockets[local_54];
          }
        }
      }
    }
    *max_fd = e._4_4_;
    multi_local._4_4_ = CURLM_OK;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_fdset(struct Curl_multi *multi,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  int this_max_fd = -1;
  struct Curl_llist_node *e;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
    struct Curl_easy *data = Curl_node_elem(e);
    unsigned int i;

    multi_getsock(data, &data->last_poll);

    for(i = 0; i < data->last_poll.num; i++) {
      if(!FDSET_SOCK(data->last_poll.sockets[i]))
        /* pretend it does not exist */
        continue;
      if(data->last_poll.actions[i] & CURL_POLL_IN)
        FD_SET(data->last_poll.sockets[i], read_fd_set);
      if(data->last_poll.actions[i] & CURL_POLL_OUT)
        FD_SET(data->last_poll.sockets[i], write_fd_set);
      if((int)data->last_poll.sockets[i] > this_max_fd)
        this_max_fd = (int)data->last_poll.sockets[i];
    }
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}